

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmNinjaNormalTargetGenerator::WriteLinkRule
          (cmNinjaNormalTargetGenerator *this,bool useResponseFile,string *config)

{
  cmGeneratorTarget *target;
  cmLocalNinjaGenerator *pcVar1;
  bool bVar2;
  TargetType targetType;
  int iVar3;
  cmGlobalNinjaGenerator *pcVar4;
  string *psVar5;
  cmValue cVar6;
  _Alloc_hider _Var7;
  undefined4 extraout_var;
  long lVar8;
  cmOutputConverter *outputConverter;
  string *linkCmd;
  pointer s;
  string_view source;
  char local_7ae [2];
  TargetType local_7ac;
  string responseFlag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkCmds;
  string lang;
  string local_748;
  string linkRuleName;
  string langFlags;
  string cmakeLinkVar;
  char *local_6c0;
  string launcher;
  string local_698;
  string linkerLauncher;
  string targetVersionMajor;
  string targetVersionMinor;
  string cmakeVarLang;
  string local_5f8;
  ostringstream majorStream;
  string local_5b8 [32];
  char local_598 [32];
  char local_578 [280];
  string cmakeCommand;
  cmNinjaRule rule;
  Names tgtNames;
  string local_70;
  string local_50;
  cmRulePlaceholderExpander *this_00;
  
  targetType = cmGeneratorTarget::GetType
                         ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                          GeneratorTarget);
  LanguageLinkerRule(&linkRuleName,this,config);
  pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  bVar2 = cmGlobalNinjaGenerator::HasRule(pcVar4,&linkRuleName);
  if (!bVar2) {
    local_5f8._M_dataplus._M_p = (pointer)&local_5f8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)linkRuleName._M_dataplus._M_p == &linkRuleName.field_2) {
      local_5f8.field_2._8_8_ = linkRuleName.field_2._8_8_;
    }
    else {
      local_5f8._M_dataplus._M_p = linkRuleName._M_dataplus._M_p;
    }
    local_5f8._M_string_length = linkRuleName._M_string_length;
    linkRuleName._M_string_length = 0;
    linkRuleName.field_2._M_local_buf[0] = '\0';
    linkRuleName._M_dataplus._M_p = (pointer)&linkRuleName.field_2;
    cmNinjaRule::cmNinjaRule(&rule,&local_5f8);
    std::__cxx11::string::~string((string *)&local_5f8);
    memset(&cmakeCommand,0,0x150);
    psVar5 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                        GeneratorTarget);
    cmakeCommand._M_dataplus._M_p = (psVar5->_M_dataplus)._M_p;
    psVar5 = cmState::GetTargetTypeName_abi_cxx11_(targetType);
    cmakeCommand._M_string_length = (size_type)(psVar5->_M_dataplus)._M_p;
    TargetLinkLanguage(&lang,this,config);
    TargetLinkLanguage((string *)&majorStream,this,config);
    std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &majorStream,"Swift");
    std::__cxx11::string::~string((string *)&majorStream);
    responseFlag._M_dataplus._M_p = (pointer)&responseFlag.field_2;
    responseFlag._M_string_length = 0;
    responseFlag.field_2._M_allocated_capacity =
         responseFlag.field_2._M_allocated_capacity & 0xffffffffffffff00;
    _majorStream = &DAT_00000006;
    TargetLinkLanguage(&cmakeLinkVar,this,config);
    tgtNames.Base._M_dataplus._M_p = (pointer)cmakeLinkVar._M_string_length;
    tgtNames.Base._M_string_length = (size_type)cmakeLinkVar._M_dataplus._M_p;
    cmStrCat<>(&cmakeVarLang,(cmAlphaNum *)&majorStream,(cmAlphaNum *)&tgtNames);
    std::__cxx11::string::~string((string *)&cmakeLinkVar);
    std::operator+(&cmakeLinkVar,&cmakeVarLang,"_RESPONSE_FILE_LINK_FLAG");
    cVar6 = cmMakefile::GetDefinition
                      ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.Makefile,
                       &cmakeLinkVar);
    if (cVar6.Value == (string *)0x0) {
      std::__cxx11::string::assign((char *)&responseFlag);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&responseFlag);
    }
    lVar8 = 0x40;
    _Var7._M_p = "$in";
    if ((useResponseFile) && (responseFlag._M_string_length != 0)) {
      std::__cxx11::string::assign((char *)&rule.RspFile);
      std::__cxx11::string::append((string *)&responseFlag);
      cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      std::__cxx11::string::assign((char *)&rule.RspContent);
      std::__cxx11::string::append((char *)&rule.RspContent);
      TargetLinkLanguage((string *)&majorStream,this,config);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &majorStream,"Swift");
      std::__cxx11::string::~string((string *)&majorStream);
      lVar8 = 0x40;
      _Var7 = responseFlag._M_dataplus;
      if (bVar2) {
        lVar8 = 0x120;
      }
    }
    *(pointer *)((long)&cmakeCommand._M_dataplus._M_p + lVar8) = _Var7._M_p;
    cmakeCommand.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_e570b9;
    targetVersionMajor._M_dataplus._M_p = (pointer)&targetVersionMajor.field_2;
    targetVersionMajor._M_string_length = 0;
    targetVersionMajor.field_2._M_local_buf[0] = '\0';
    targetVersionMinor._M_dataplus._M_p = (pointer)&targetVersionMinor.field_2;
    targetVersionMinor._M_string_length = 0;
    targetVersionMinor.field_2._M_local_buf[0] = '\0';
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&majorStream);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&tgtNames);
    cmGeneratorTarget::GetTargetVersion
              ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
               (int *)&linkerLauncher,(int *)&launcher);
    std::ostream::operator<<(&majorStream,(int)linkerLauncher._M_dataplus._M_p);
    std::ostream::operator<<(&tgtNames,(int)launcher._M_dataplus._M_p);
    std::__cxx11::stringbuf::str();
    local_7ac = targetType;
    std::__cxx11::string::operator=((string *)&targetVersionMajor,(string *)&langFlags);
    std::__cxx11::string::~string((string *)&langFlags);
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::operator=((string *)&targetVersionMinor,(string *)&langFlags);
    std::__cxx11::string::~string((string *)&langFlags);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tgtNames);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&majorStream);
    langFlags._M_dataplus._M_p = (pointer)&langFlags.field_2;
    langFlags._M_string_length = 0;
    langFlags.field_2._M_local_buf[0] = '\0';
    if (local_7ac != EXECUTABLE) {
      std::__cxx11::string::append((char *)&langFlags);
    }
    cmCommonTargetGenerator::GetLinkerLauncher
              (&linkerLauncher,(cmCommonTargetGenerator *)this,config);
    launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
    launcher._M_string_length = 0;
    launcher.field_2._M_local_buf[0] = '\0';
    target = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
    pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&majorStream,"RULE_LAUNCH_LINK",(allocator<char> *)&tgtNames);
    cVar6 = cmLocalGenerator::GetRuleLauncher
                      ((cmLocalGenerator *)pcVar1,target,(string *)&majorStream);
    std::__cxx11::string::~string((string *)&majorStream);
    if ((cVar6.Value != (string *)0x0) && ((pointer)(cVar6.Value)->_M_string_length != (pointer)0x0)
       ) {
      tgtNames.Base._M_string_length = (size_type)&tgtNames.Base.field_2;
      tgtNames.Base._M_dataplus._M_p = (pointer)0x1;
      tgtNames.Base.field_2._M_local_buf[0] = ' ';
      _majorStream = (pointer)(cVar6.Value)->_M_string_length;
      cmStrCat<>(&local_698,(cmAlphaNum *)&majorStream,(cmAlphaNum *)&tgtNames);
      std::__cxx11::string::operator=((string *)&launcher,(string *)&local_698);
      std::__cxx11::string::~string((string *)&local_698);
    }
    iVar3 = (*(((this->super_cmNinjaTargetGenerator).LocalGenerator)->super_cmLocalCommonGenerator).
              super_cmLocalGenerator._vptr_cmLocalGenerator[5])();
    this_00 = (cmRulePlaceholderExpander *)CONCAT44(extraout_var,iVar3);
    ComputeLinkCmd(&linkCmds,this,config);
    for (s = linkCmds.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        s != linkCmds.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; s = s + 1) {
      _majorStream = (pointer)launcher._M_string_length;
      tgtNames.Base._M_string_length = (size_type)(s->_M_dataplus)._M_p;
      tgtNames.Base._M_dataplus._M_p = (pointer)s->_M_string_length;
      cmStrCat<>(&local_698,(cmAlphaNum *)&majorStream,(cmAlphaNum *)&tgtNames);
      std::__cxx11::string::operator=((string *)s,(string *)&local_698);
      std::__cxx11::string::~string((string *)&local_698);
      pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
      outputConverter =
           &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
      if (pcVar1 == (cmLocalNinjaGenerator *)0x0) {
        outputConverter = (cmOutputConverter *)0x0;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                (this_00,outputConverter,s,(RuleVariables *)&cmakeCommand);
    }
    ::cm::
    erase_if<std::__cxx11::string,std::allocator<std::__cxx11::string>,cmNinjaRemoveNoOpCommands>
              (&linkCmds);
    targetType = local_7ac;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&majorStream,"$PRE_LINK",(allocator<char> *)&tgtNames);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval(&linkCmds,
                     (const_iterator)
                     linkCmds.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,(value_type *)&majorStream);
    std::__cxx11::string::~string((string *)&majorStream);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[12]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&linkCmds,
               (char (*) [12])"$POST_BUILD");
    tgtNames.Base._M_dataplus._M_p = (pointer)&tgtNames.Base.field_2;
    tgtNames.Base._M_string_length = 0;
    tgtNames.Base.field_2._M_local_buf[0] = '\0';
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)&majorStream,(this->super_cmNinjaTargetGenerator).LocalGenerator,&linkCmds,
               config,config,&tgtNames.Base,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=((string *)&rule.Command,(string *)&majorStream);
    std::__cxx11::string::~string((string *)&majorStream);
    std::__cxx11::string::~string((string *)&tgtNames);
    _majorStream = &DAT_00000011;
    TargetLinkLanguage(&local_748,this,config);
    tgtNames.Base._M_dataplus._M_p = (pointer)local_748._M_string_length;
    tgtNames.Base._M_string_length = (size_type)local_748._M_dataplus._M_p;
    local_7ae[0] = ' ';
    local_6c0 = GetVisibleTypeName(this);
    local_7ae[1] = 0x2e;
    cmStrCat<char,char_const*,char>
              (&local_698,(cmAlphaNum *)&majorStream,(cmAlphaNum *)&tgtNames,local_7ae,&local_6c0,
               local_7ae + 1);
    std::__cxx11::string::operator=((string *)&rule.Comment,(string *)&local_698);
    std::__cxx11::string::~string((string *)&local_698);
    std::__cxx11::string::~string((string *)&local_748);
    _majorStream = (pointer)0x8;
    TargetLinkLanguage(&local_748,this,config);
    tgtNames.Base._M_dataplus._M_p = (pointer)local_748._M_string_length;
    tgtNames.Base._M_string_length = (size_type)local_748._M_dataplus._M_p;
    local_7ae[0] = ' ';
    local_6c0 = GetVisibleTypeName(this);
    cmStrCat<char,char_const*,char[14]>
              (&local_698,(cmAlphaNum *)&majorStream,(cmAlphaNum *)&tgtNames,local_7ae,&local_6c0,
               (char (*) [14])0x5e1967);
    std::__cxx11::string::operator=((string *)&rule.Description,(string *)&local_698);
    std::__cxx11::string::~string((string *)&local_698);
    std::__cxx11::string::~string((string *)&local_748);
    std::__cxx11::string::assign((char *)&rule.Restat);
    pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::AddRule(pcVar4,&rule);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&linkCmds);
    if (this_00 != (cmRulePlaceholderExpander *)0x0) {
      (*(this_00->super_cmPlaceholderExpander)._vptr_cmPlaceholderExpander[1])(this_00);
    }
    std::__cxx11::string::~string((string *)&launcher);
    std::__cxx11::string::~string((string *)&linkerLauncher);
    std::__cxx11::string::~string((string *)&langFlags);
    std::__cxx11::string::~string((string *)&targetVersionMinor);
    std::__cxx11::string::~string((string *)&targetVersionMajor);
    std::__cxx11::string::~string((string *)&cmakeLinkVar);
    std::__cxx11::string::~string((string *)&cmakeVarLang);
    std::__cxx11::string::~string((string *)&responseFlag);
    std::__cxx11::string::~string((string *)&lang);
    cmNinjaRule::~cmNinjaRule(&rule);
  }
  TargetNames(&tgtNames,this,config);
  bVar2 = std::operator!=(&tgtNames.Output,&tgtNames.Real);
  if ((bVar2) &&
     (bVar2 = cmGeneratorTarget::IsFrameworkOnApple
                        ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                         GeneratorTarget), !bVar2)) {
    pcVar1 = (this->super_cmNinjaTargetGenerator).LocalGenerator;
    psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    source._M_str = (psVar5->_M_dataplus)._M_p;
    source._M_len = psVar5->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&cmakeCommand,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source,SHELL);
    if (targetType == EXECUTABLE) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"CMAKE_SYMLINK_EXECUTABLE",(allocator<char> *)&rule);
      cmNinjaRule::cmNinjaRule((cmNinjaRule *)&majorStream,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      responseFlag._M_dataplus._M_p = (pointer)0x0;
      responseFlag._M_string_length = 0;
      responseFlag.field_2._M_allocated_capacity = 0;
      std::operator+(&rule.Name,&cmakeCommand," -E cmake_symlink_executable $in $out");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&responseFlag,
                 &rule.Name);
      std::__cxx11::string::~string((string *)&rule);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[12]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&responseFlag,
                 (char (*) [12])"$POST_BUILD");
      lang._M_dataplus._M_p = (pointer)&lang.field_2;
      lang._M_string_length = 0;
      lang.field_2._M_local_buf[0] = '\0';
      cmLocalNinjaGenerator::BuildCommandLine
                (&rule.Name,(this->super_cmNinjaTargetGenerator).LocalGenerator,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&responseFlag,config,config,&lang,(cmGeneratorTarget *)0x0);
      std::__cxx11::string::operator=(local_5b8,(string *)&rule);
      std::__cxx11::string::~string((string *)&rule);
      std::__cxx11::string::~string((string *)&lang);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&responseFlag);
      std::__cxx11::string::assign(local_598);
      std::__cxx11::string::assign(local_578);
      pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::AddRule(pcVar4,(cmNinjaRule *)&majorStream);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"CMAKE_SYMLINK_LIBRARY",(allocator<char> *)&rule);
      cmNinjaRule::cmNinjaRule((cmNinjaRule *)&majorStream,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      responseFlag._M_dataplus._M_p = (pointer)0x0;
      responseFlag._M_string_length = 0;
      responseFlag.field_2._M_allocated_capacity = 0;
      std::operator+(&rule.Name,&cmakeCommand," -E cmake_symlink_library $in $SONAME $out");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&responseFlag,
                 &rule.Name);
      std::__cxx11::string::~string((string *)&rule);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[12]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&responseFlag,
                 (char (*) [12])"$POST_BUILD");
      lang._M_dataplus._M_p = (pointer)&lang.field_2;
      lang._M_string_length = 0;
      lang.field_2._M_local_buf[0] = '\0';
      cmLocalNinjaGenerator::BuildCommandLine
                (&rule.Name,(this->super_cmNinjaTargetGenerator).LocalGenerator,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&responseFlag,config,config,&lang,(cmGeneratorTarget *)0x0);
      std::__cxx11::string::operator=(local_5b8,(string *)&rule);
      std::__cxx11::string::~string((string *)&rule);
      std::__cxx11::string::~string((string *)&lang);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&responseFlag);
      std::__cxx11::string::assign(local_598);
      std::__cxx11::string::assign(local_578);
      pcVar4 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::AddRule(pcVar4,(cmNinjaRule *)&majorStream);
    }
    cmNinjaRule::~cmNinjaRule((cmNinjaRule *)&majorStream);
    std::__cxx11::string::~string((string *)&cmakeCommand);
  }
  cmGeneratorTarget::Names::~Names(&tgtNames);
  std::__cxx11::string::~string((string *)&linkRuleName);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteLinkRule(bool useResponseFile,
                                                 const std::string& config)
{
  cmStateEnums::TargetType targetType = this->GetGeneratorTarget()->GetType();

  std::string linkRuleName = this->LanguageLinkerRule(config);
  if (!this->GetGlobalGenerator()->HasRule(linkRuleName)) {
    cmNinjaRule rule(std::move(linkRuleName));
    cmRulePlaceholderExpander::RuleVariables vars;
    vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
    vars.CMTargetType = cmState::GetTargetTypeName(targetType).c_str();

    std::string lang = this->TargetLinkLanguage(config);
    vars.Language = lang.c_str();
    vars.AIXExports = "$AIX_EXPORTS";

    if (this->TargetLinkLanguage(config) == "Swift") {
      vars.SwiftLibraryName = "$SWIFT_LIBRARY_NAME";
      vars.SwiftModule = "$SWIFT_MODULE";
      vars.SwiftModuleName = "$SWIFT_MODULE_NAME";
      vars.SwiftSources = "$SWIFT_SOURCES";

      vars.Defines = "$DEFINES";
      vars.Flags = "$FLAGS";
      vars.Includes = "$INCLUDES";
    }

    std::string responseFlag;

    std::string cmakeVarLang =
      cmStrCat("CMAKE_", this->TargetLinkLanguage(config));

    // build response file name
    std::string cmakeLinkVar = cmakeVarLang + "_RESPONSE_FILE_LINK_FLAG";
    cmValue flag = this->GetMakefile()->GetDefinition(cmakeLinkVar);

    if (flag) {
      responseFlag = *flag;
    } else {
      responseFlag = "@";
    }

    if (!useResponseFile || responseFlag.empty()) {
      vars.Objects = "$in";
      vars.LinkLibraries = "$LINK_PATH $LINK_LIBRARIES";
    } else {
      rule.RspFile = "$RSP_FILE";
      responseFlag += rule.RspFile;

      // build response file content
      if (this->GetGlobalGenerator()->IsGCCOnWindows()) {
        rule.RspContent = "$in";
      } else {
        rule.RspContent = "$in_newline";
      }
      rule.RspContent += " $LINK_PATH $LINK_LIBRARIES";
      if (this->TargetLinkLanguage(config) == "Swift") {
        vars.SwiftSources = responseFlag.c_str();
      } else {
        vars.Objects = responseFlag.c_str();
      }
      vars.LinkLibraries = "";
    }

    vars.ObjectDir = "$OBJECT_DIR";

    vars.Target = "$TARGET_FILE";

    vars.SONameFlag = "$SONAME_FLAG";
    vars.TargetSOName = "$SONAME";
    vars.TargetInstallNameDir = "$INSTALLNAME_DIR";
    vars.TargetPDB = "$TARGET_PDB";

    // Setup the target version.
    std::string targetVersionMajor;
    std::string targetVersionMinor;
    {
      std::ostringstream majorStream;
      std::ostringstream minorStream;
      int major;
      int minor;
      this->GetGeneratorTarget()->GetTargetVersion(major, minor);
      majorStream << major;
      minorStream << minor;
      targetVersionMajor = majorStream.str();
      targetVersionMinor = minorStream.str();
    }
    vars.TargetVersionMajor = targetVersionMajor.c_str();
    vars.TargetVersionMinor = targetVersionMinor.c_str();

    vars.Flags = "$FLAGS";
    vars.LinkFlags = "$LINK_FLAGS";
    vars.Manifests = "$MANIFESTS";

    std::string langFlags;
    if (targetType != cmStateEnums::EXECUTABLE) {
      langFlags += "$LANGUAGE_COMPILE_FLAGS $ARCH_FLAGS";
      vars.LanguageCompileFlags = langFlags.c_str();
    }

    std::string linkerLauncher = this->GetLinkerLauncher(config);
    if (cmNonempty(linkerLauncher)) {
      vars.Launcher = linkerLauncher.c_str();
    }

    std::string launcher;
    cmValue val = this->GetLocalGenerator()->GetRuleLauncher(
      this->GetGeneratorTarget(), "RULE_LAUNCH_LINK");
    if (cmNonempty(val)) {
      launcher = cmStrCat(*val, ' ');
    }

    std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
      this->GetLocalGenerator()->CreateRulePlaceholderExpander());

    // Rule for linking library/executable.
    std::vector<std::string> linkCmds = this->ComputeLinkCmd(config);
    for (std::string& linkCmd : linkCmds) {
      linkCmd = cmStrCat(launcher, linkCmd);
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   linkCmd, vars);
    }

    // If there is no ranlib the command will be ":".  Skip it.
    cm::erase_if(linkCmds, cmNinjaRemoveNoOpCommands());

    linkCmds.insert(linkCmds.begin(), "$PRE_LINK");
    linkCmds.emplace_back("$POST_BUILD");
    rule.Command =
      this->GetLocalGenerator()->BuildCommandLine(linkCmds, config, config);

    // Write the linker rule with response file if needed.
    rule.Comment =
      cmStrCat("Rule for linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), '.');
    rule.Description =
      cmStrCat("Linking ", this->TargetLinkLanguage(config), ' ',
               this->GetVisibleTypeName(), " $TARGET_FILE");
    rule.Restat = "$RESTAT";
    this->GetGlobalGenerator()->AddRule(rule);
  }

  auto const tgtNames = this->TargetNames(config);
  if (tgtNames.Output != tgtNames.Real &&
      !this->GetGeneratorTarget()->IsFrameworkOnApple()) {
    std::string cmakeCommand =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
    if (targetType == cmStateEnums::EXECUTABLE) {
      cmNinjaRule rule("CMAKE_SYMLINK_EXECUTABLE");
      {
        std::vector<std::string> cmd;
        cmd.push_back(cmakeCommand + " -E cmake_symlink_executable $in $out");
        cmd.emplace_back("$POST_BUILD");
        rule.Command =
          this->GetLocalGenerator()->BuildCommandLine(cmd, config, config);
      }
      rule.Description = "Creating executable symlink $out";
      rule.Comment = "Rule for creating executable symlink.";
      this->GetGlobalGenerator()->AddRule(rule);
    } else {
      cmNinjaRule rule("CMAKE_SYMLINK_LIBRARY");
      {
        std::vector<std::string> cmd;
        cmd.push_back(cmakeCommand +
                      " -E cmake_symlink_library $in $SONAME $out");
        cmd.emplace_back("$POST_BUILD");
        rule.Command =
          this->GetLocalGenerator()->BuildCommandLine(cmd, config, config);
      }
      rule.Description = "Creating library symlink $out";
      rule.Comment = "Rule for creating library symlink.";
      this->GetGlobalGenerator()->AddRule(rule);
    }
  }
}